

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<SpvDecoration_,_8UL>::SmallVector(SmallVector<SpvDecoration_,_8UL> *this)

{
  SpvDecoration_ *pSVar1;
  SmallVector<SpvDecoration_,_8UL> *this_local;
  
  VectorView<SpvDecoration_>::VectorView(&this->super_VectorView<SpvDecoration_>);
  this->buffer_capacity = 0;
  pSVar1 = AlignedBuffer<SpvDecoration_,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<SpvDecoration_>).ptr = pSVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}